

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall soplex::SPxDevexPR<double>::selectLeave(SPxDevexPR<double> *this)

{
  double feastol;
  SPxSolverBase<double> *pSVar1;
  SPxOut *pSVar2;
  int iVar3;
  Verbosity old_verbosity;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if ((pSVar1->hyperPricingLeave == true) && ((pSVar1->sparsePricingLeave & 1U) != 0)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      iVar3 = buildBestPriceVectorLeave(this,(this->super_SPxPricer<double>).thetolerance);
    }
    else {
      iVar3 = selectLeaveHyper(this,(this->super_SPxPricer<double>).thetolerance);
    }
  }
  else {
    feastol = (this->super_SPxPricer<double>).thetolerance;
    if ((pSVar1->sparsePricingLeave & 1U) == 0) {
      iVar3 = selectLeaveX(this,feastol,0,1);
    }
    else {
      iVar3 = selectLeaveSparse(this,feastol);
    }
  }
  if ((iVar3 < 0) && (this->refined == false)) {
    this->refined = true;
    pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
      (*pSVar2->_vptr_SPxOut[2])();
      soplex::operator<<(((this->super_SPxPricer<double>).thesolver)->spxout,
                         "WDEVEX02 trying refinement step..\n");
      (*((this->super_SPxPricer<double>).thesolver)->spxout->_vptr_SPxOut[2])();
    }
    iVar3 = selectLeaveX(this,(this->super_SPxPricer<double>).thetolerance * 0.5,0,1);
  }
  return iVar3;
}

Assistant:

int SPxDevexPR<R>::selectLeave()
{
   int retid;

   if(this->thesolver->hyperPricingLeave && this->thesolver->sparsePricingLeave)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
      {
         // call init method to build up price-vector and return index of largest price
         retid = buildBestPriceVectorLeave(this->thetolerance);
      }
      else
         retid = selectLeaveHyper(this->thetolerance);
   }
   else if(this->thesolver->sparsePricingLeave)
      retid = selectLeaveSparse(this->thetolerance);
   else
      retid = selectLeaveX(this->thetolerance);

   if(retid < 0 && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      retid = selectLeaveX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);
   }

   assert(retid < this->thesolver->dim());

   return retid;
}